

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

ON_V4V5_MeshNgonUserData * __thiscall
ON_V4V5_MeshNgonUserData::Duplicate(ON_V4V5_MeshNgonUserData *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(this->super_ON_UserData).super_ON_Object._vptr_ON_Object[2])();
  return (ON_V4V5_MeshNgonUserData *)CONCAT44(extraout_var,iVar1);
}

Assistant:

ON_V4V5_MeshNgonUserData::ON_V4V5_MeshNgonUserData()
{
  m_userdata_uuid = ON_CLASS_ID(ON_V4V5_MeshNgonUserData);
  m_application_uuid = ON_opennurbs4_id;
  m_userdata_copycount = 1;
  m_ngon_list = 0;
  m_mesh_F_count = 0;
  m_mesh_V_count = 0;
}